

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::Render(void)

{
  int *piVar1;
  ImVector<ImDrawList_*> *out_render_list;
  ImDrawList *this;
  ImVec2 *uv0;
  ImVec2 *uv1;
  int iVar2;
  void *pvVar3;
  ImGuiWindow *window;
  ImDrawList **ppIVar4;
  ImTextureID user_texture_id;
  _func_void_ImDrawData_ptr *UNRECOVERED_JUMPTABLE;
  ImGuiContext *pIVar5;
  ImGuiContext *pIVar6;
  undefined1 auVar7 [16];
  void *__dest;
  ulong uVar8;
  ImDrawList **__dest_00;
  char *__function;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  ImVec2 pos;
  ImTextureID tex_id;
  ImVec2 local_a8;
  float local_a0;
  float local_9c;
  undefined1 local_98 [8];
  undefined4 uStack_90;
  undefined4 uStack_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 *local_78;
  ImVec2 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ImTextureID local_38;
  
  pIVar5 = GImGui;
  if (GImGui->Initialized == false) {
    __assert_fail("g.Initialized",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.cpp"
                  ,0xa6e,"void ImGui::Render()");
  }
  if (GImGui->FrameCountEnded != GImGui->FrameCount) {
    EndFrame();
  }
  pIVar5->FrameCountRendered = pIVar5->FrameCount;
  if (0.0 < (pIVar5->Style).Alpha) {
    (pIVar5->IO).MetricsActiveWindows = 0;
    (pIVar5->IO).MetricsRenderVertices = 0;
    (pIVar5->IO).MetricsRenderIndices = 0;
    lVar11 = 0;
    do {
      pIVar6 = GImGui;
      iVar10 = *(int *)((long)&pIVar5->RenderDrawLists[0].Capacity + lVar11);
      if (iVar10 < 0) {
        uVar12 = iVar10 / 2 + iVar10;
        uVar8 = (ulong)uVar12;
        if ((int)uVar12 < 1) {
          uVar8 = 0;
        }
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest = (*(pIVar6->IO).MemAllocFn)(uVar8 * 8);
        pvVar3 = *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar11);
        if (pvVar3 != (void *)0x0) {
          memcpy(__dest,pvVar3,(long)*(int *)((long)&pIVar5->RenderDrawLists[0].Size + lVar11) << 3)
          ;
        }
        pvVar3 = *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar11);
        if (pvVar3 != (void *)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(pvVar3);
        *(void **)((long)&pIVar5->RenderDrawLists[0].Data + lVar11) = __dest;
        *(int *)((long)&pIVar5->RenderDrawLists[0].Capacity + lVar11) = (int)uVar8;
      }
      *(undefined4 *)((long)&pIVar5->RenderDrawLists[0].Size + lVar11) = 0;
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x30);
    uVar12 = (pIVar5->Windows).Size;
    uVar8 = (ulong)uVar12;
    if (uVar12 != 0) {
      uVar14 = 0;
      do {
        if ((long)(int)uVar8 <= (long)uVar14) {
          __function = "value_type &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
          goto LAB_00133fd5;
        }
        window = (pIVar5->Windows).Data[uVar14];
        if (((window->Active == true) && (window->HiddenFrames < 1)) &&
           (uVar12 = window->Flags, (uVar12 >> 0x14 & 1) == 0)) {
          piVar1 = &(pIVar5->IO).MetricsActiveWindows;
          *piVar1 = *piVar1 + 1;
          lVar11 = (ulong)(uVar12 >> 0x13 & 0x20) + 0x18b0;
          if ((uVar12 >> 0x19 & 1) != 0) {
            lVar11 = 0x18c0;
          }
          AddWindowToRenderList
                    ((ImVector<ImDrawList_*> *)((long)(pIVar5->IO).KeyMap + lVar11 + -0x34),window);
        }
        uVar14 = uVar14 + 1;
        uVar8 = (ulong)(uint)(pIVar5->Windows).Size;
      } while (uVar14 != uVar8);
    }
    pIVar6 = GImGui;
    out_render_list = pIVar5->RenderDrawLists;
    iVar10 = pIVar5->RenderDrawLists[0].Size;
    lVar11 = 0;
    iVar9 = iVar10;
    do {
      iVar9 = iVar9 + *(int *)((long)&pIVar5->RenderDrawLists[1].Size + lVar11);
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x20);
    iVar2 = pIVar5->RenderDrawLists[0].Capacity;
    if (iVar2 < iVar9) {
      if (iVar2 == 0) {
        iVar13 = 8;
      }
      else {
        iVar13 = iVar2 / 2 + iVar2;
      }
      if (iVar13 <= iVar9) {
        iVar13 = iVar9;
      }
      if (iVar2 < iVar13) {
        piVar1 = &(GImGui->IO).MetricsAllocs;
        *piVar1 = *piVar1 + 1;
        __dest_00 = (ImDrawList **)(*(pIVar6->IO).MemAllocFn)((long)iVar13 << 3);
        ppIVar4 = pIVar5->RenderDrawLists[0].Data;
        if (ppIVar4 != (ImDrawList **)0x0) {
          memcpy(__dest_00,ppIVar4,(long)out_render_list->Size << 3);
        }
        ppIVar4 = pIVar5->RenderDrawLists[0].Data;
        if (ppIVar4 != (ImDrawList **)0x0) {
          piVar1 = &(GImGui->IO).MetricsAllocs;
          *piVar1 = *piVar1 + -1;
        }
        (*(GImGui->IO).MemFreeFn)(ppIVar4);
        pIVar5->RenderDrawLists[0].Data = __dest_00;
        pIVar5->RenderDrawLists[0].Capacity = iVar13;
      }
    }
    pIVar5->RenderDrawLists[0].Size = iVar9;
    lVar11 = 0;
    do {
      uVar12 = *(uint *)((long)&pIVar5->RenderDrawLists[1].Size + lVar11);
      if ((ulong)uVar12 != 0) {
        if ((out_render_list->Size <= iVar10) || ((int)uVar12 < 1)) {
          __function = "value_type &ImVector<ImDrawList *>::operator[](int) [T = ImDrawList *]";
LAB_00133fd5:
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui.h"
                        ,0x353,__function);
        }
        memcpy(pIVar5->RenderDrawLists[0].Data + iVar10,
               *(void **)((long)&pIVar5->RenderDrawLists[1].Data + lVar11),(ulong)uVar12 << 3);
        iVar10 = iVar10 + *(int *)((long)&pIVar5->RenderDrawLists[1].Size + lVar11);
      }
      lVar11 = lVar11 + 0x10;
    } while (lVar11 != 0x20);
    if ((pIVar5->IO).MouseDrawCursor != false) {
      iVar10 = pIVar5->MouseCursor;
      local_70 = pIVar5->MouseCursorData[iVar10].TexUvMin;
      local_80.y = (pIVar5->IO).MousePos.y - pIVar5->MouseCursorData[iVar10].HotOffset.y;
      local_80.x = (pIVar5->IO).MousePos.x - pIVar5->MouseCursorData[iVar10].HotOffset.x;
      _local_98 = ZEXT416((uint)pIVar5->MouseCursorData[iVar10].Size.x);
      local_68 = ZEXT416((uint)pIVar5->MouseCursorData[iVar10].Size.y);
      user_texture_id = ((pIVar5->IO).Fonts)->TexID;
      this = &pIVar5->OverlayDrawList;
      local_38 = user_texture_id;
      ImDrawList::PushTextureID(this,&local_38);
      local_a0 = local_80.x;
      local_9c = local_80.y;
      local_48 = local_80.y + 0.0;
      local_58 = ZEXT416((uint)local_48);
      local_a8.y = local_48;
      local_a8.x = local_80.x + 1.0;
      local_48 = (float)local_68._0_4_ + local_48;
      uStack_44 = local_68._4_4_;
      uStack_40 = local_68._8_4_;
      uStack_3c = local_68._12_4_;
      local_88.y = local_48;
      local_88.x = (float)local_98._0_4_ + local_80.x + 1.0;
      uv0 = pIVar5->MouseCursorData[iVar10].TexUvMin + 1;
      local_78 = pIVar5->MouseCursorData[iVar10].TexUvMax;
      uv1 = pIVar5->MouseCursorData[iVar10].TexUvMax + 1;
      ImDrawList::AddImage(this,user_texture_id,&local_a8,&local_88,uv0,uv1,0x30000000);
      local_a8.y = (float)local_58._0_4_;
      local_a8.x = local_a0 + 2.0;
      local_88.y = local_48;
      local_88.x = (float)local_98._0_4_ + local_a0 + 2.0;
      ImDrawList::AddImage(this,user_texture_id,&local_a8,&local_88,uv0,uv1,0x30000000);
      uStack_90 = local_98._4_4_;
      local_98._0_4_ = (float)local_98._0_4_ + local_a0;
      local_98._4_4_ = (float)local_68._0_4_ + local_9c;
      uStack_8c = local_68._4_4_;
      local_a8.y = (float)local_68._0_4_ + local_9c;
      local_a8.x = (float)local_98._0_4_;
      ImDrawList::AddImage(this,user_texture_id,&local_80,&local_a8,uv0,uv1,0xff000000);
      auVar7 = _local_98;
      local_a8.x = (float)local_98._0_4_;
      local_a8.y = (float)local_98._4_4_;
      _local_98 = auVar7;
      ImDrawList::AddImage(this,user_texture_id,&local_80,&local_a8,local_70,local_78,0xffffffff);
      ImDrawList::PopTextureID(this);
    }
    if ((pIVar5->OverlayDrawList).VtxBuffer.Size != 0) {
      AddDrawListToRenderList(out_render_list,&pIVar5->OverlayDrawList);
    }
    (pIVar5->RenderDrawData).Valid = true;
    iVar10 = pIVar5->RenderDrawLists[0].Size;
    if (iVar10 < 1) {
      (pIVar5->RenderDrawData).CmdLists = (ImDrawList **)0x0;
      (pIVar5->RenderDrawData).CmdListsCount = iVar10;
      iVar10 = (pIVar5->IO).MetricsRenderIndices;
      (pIVar5->RenderDrawData).TotalVtxCount = (pIVar5->IO).MetricsRenderVertices;
      (pIVar5->RenderDrawData).TotalIdxCount = iVar10;
    }
    else {
      (pIVar5->RenderDrawData).CmdLists = pIVar5->RenderDrawLists[0].Data;
      (pIVar5->RenderDrawData).CmdListsCount = iVar10;
      iVar10 = (pIVar5->IO).MetricsRenderIndices;
      (pIVar5->RenderDrawData).TotalVtxCount = (pIVar5->IO).MetricsRenderVertices;
      (pIVar5->RenderDrawData).TotalIdxCount = iVar10;
      UNRECOVERED_JUMPTABLE = (pIVar5->IO).RenderDrawListsFn;
      if (UNRECOVERED_JUMPTABLE != (_func_void_ImDrawData_ptr *)0x0) {
        (*UNRECOVERED_JUMPTABLE)(&pIVar5->RenderDrawData);
        return;
      }
    }
  }
  return;
}

Assistant:

void ImGui::Render()
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(g.Initialized);   // Forgot to call ImGui::NewFrame()

    if (g.FrameCountEnded != g.FrameCount)
        ImGui::EndFrame();
    g.FrameCountRendered = g.FrameCount;

    // Skip render altogether if alpha is 0.0
    // Note that vertex buffers have been created and are wasted, so it is best practice that you don't create windows in the first place, or consistently respond to Begin() returning false.
    if (g.Style.Alpha > 0.0f)
    {
        // Gather windows to render
        g.IO.MetricsRenderVertices = g.IO.MetricsRenderIndices = g.IO.MetricsActiveWindows = 0;
        for (int i = 0; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            g.RenderDrawLists[i].resize(0);
        for (int i = 0; i != g.Windows.Size; i++)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window->Active && window->HiddenFrames <= 0 && (window->Flags & (ImGuiWindowFlags_ChildWindow)) == 0)
            {
                // FIXME: Generalize this with a proper layering system so e.g. user can draw in specific layers, below text, ..
                g.IO.MetricsActiveWindows++;
                if (window->Flags & ImGuiWindowFlags_Popup)
                    AddWindowToRenderList(g.RenderDrawLists[1], window);
                else if (window->Flags & ImGuiWindowFlags_Tooltip)
                    AddWindowToRenderList(g.RenderDrawLists[2], window);
                else
                    AddWindowToRenderList(g.RenderDrawLists[0], window);
            }
        }

        // Flatten layers
        int n = g.RenderDrawLists[0].Size;
        int flattened_size = n;
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
            flattened_size += g.RenderDrawLists[i].Size;
        g.RenderDrawLists[0].resize(flattened_size);
        for (int i = 1; i < IM_ARRAYSIZE(g.RenderDrawLists); i++)
        {
            ImVector<ImDrawList*>& layer = g.RenderDrawLists[i];
            if (layer.empty())
                continue;
            memcpy(&g.RenderDrawLists[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
            n += layer.Size;
        }

        // Draw software mouse cursor if requested
        if (g.IO.MouseDrawCursor)
        {
            const ImGuiMouseCursorData& cursor_data = g.MouseCursorData[g.MouseCursor];
            const ImVec2 pos = g.IO.MousePos - cursor_data.HotOffset;
            const ImVec2 size = cursor_data.Size;
            const ImTextureID tex_id = g.IO.Fonts->TexID;
            g.OverlayDrawList.PushTextureID(tex_id);
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(1,0), pos+ImVec2(1,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos+ImVec2(2,0), pos+ImVec2(2,0) + size, cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,48));        // Shadow
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[1], cursor_data.TexUvMax[1], IM_COL32(0,0,0,255));       // Black border
            g.OverlayDrawList.AddImage(tex_id, pos,             pos + size,             cursor_data.TexUvMin[0], cursor_data.TexUvMax[0], IM_COL32(255,255,255,255)); // White fill
            g.OverlayDrawList.PopTextureID();
        }
        if (!g.OverlayDrawList.VtxBuffer.empty())
            AddDrawListToRenderList(g.RenderDrawLists[0], &g.OverlayDrawList);

        // Setup draw data
        g.RenderDrawData.Valid = true;
        g.RenderDrawData.CmdLists = (g.RenderDrawLists[0].Size > 0) ? &g.RenderDrawLists[0][0] : NULL;
        g.RenderDrawData.CmdListsCount = g.RenderDrawLists[0].Size;
        g.RenderDrawData.TotalVtxCount = g.IO.MetricsRenderVertices;
        g.RenderDrawData.TotalIdxCount = g.IO.MetricsRenderIndices;

        // Render. If user hasn't set a callback then they may retrieve the draw data via GetDrawData()
        if (g.RenderDrawData.CmdListsCount > 0 && g.IO.RenderDrawListsFn != NULL)
            g.IO.RenderDrawListsFn(&g.RenderDrawData);
    }
}